

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateOptionalArrayedI32
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  spv_result_t sVar1;
  Op OVar2;
  Instruction *pIVar3;
  uint32_t underlying_type;
  uint32_t local_24;
  
  local_24 = 0;
  sVar1 = GetUnderlyingType(this->_,decoration,inst,&local_24);
  if (sVar1 == SPV_SUCCESS) {
    OVar2 = ValidationState_t::GetIdOpcode(this->_,local_24);
    if (OVar2 == OpTypeArray) {
      pIVar3 = ValidationState_t::FindDef(this->_,local_24);
      local_24 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[2];
    }
    sVar1 = ValidateI32Helper(this,decoration,inst,diag,local_24);
  }
  return sVar1;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateOptionalArrayedI32(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  // Strip the array, if present.
  if (_.GetIdOpcode(underlying_type) == spv::Op::OpTypeArray) {
    underlying_type = _.FindDef(underlying_type)->word(2u);
  }

  return ValidateI32Helper(decoration, inst, diag, underlying_type);
}